

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O0

void __thiscall mocker::nasm::Db::~Db(Db *this)

{
  Db *this_local;
  
  (this->super_Inst)._vptr_Inst = (_func_int **)&PTR__Db_0039b400;
  std::__cxx11::string::~string((string *)&this->data);
  Inst::~Inst(&this->super_Inst);
  return;
}

Assistant:

explicit Db(std::string data) : data(std::move(data)) {}